

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_EndpointType.h
# Opt level: O3

bool soul::isMIDIEventEndpoint(Endpoint *details)

{
  bool bVar1;
  int iVar2;
  
  if (details->type != event) {
    return false;
  }
  if ((*(long *)&details->field_0x50 - (long)*(Type **)&details->valueTypes == 0x20) &&
     (bVar1 = isMIDIMessageStruct(*(Type **)&details->valueTypes), bVar1)) {
    iVar2 = std::__cxx11::string::compare((char *)&details->name);
    return iVar2 != 0;
  }
  return false;
}

Assistant:

inline bool isEvent  (EndpointType t)         { return t == EndpointType::event; }